

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__arr_insertn_(void **pp,int size,int i,int n)

{
  int local_30;
  void *pvStack_28;
  int z;
  void *p;
  int local_18;
  int n_local;
  int i_local;
  int size_local;
  void **pp_local;
  
  pvStack_28 = *pp;
  _i_local = pp;
  if (n != 0) {
    p._4_4_ = n;
    local_18 = i;
    n_local = size;
    if (pvStack_28 == (void *)0x0) {
      stb__arr_addlen_(pp,size,n);
      return;
    }
    if (pvStack_28 == (void *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = *(int *)((long)pvStack_28 + -0x10);
    }
    stb__arr_addlen_(&stack0xffffffffffffffd8,size,n);
    memmove((void *)((long)pvStack_28 + (long)((local_18 + p._4_4_) * n_local)),
            (void *)((long)pvStack_28 + (long)(local_18 * n_local)),
            (long)(n_local * (local_30 - local_18)));
  }
  *_i_local = pvStack_28;
  return;
}

Assistant:

void stb__arr_insertn_(void **pp, int size, int i, int n  STB__PARAMS)
{
   void *p = *pp;
   if (n) {
      int z;

      if (p == NULL) {
         stb__arr_addlen_(pp, size, n  STB__ARGS);
         return;
      }

      z = stb_arr_len2(p);
      stb__arr_addlen_(&p, size, n  STB__ARGS);
      memmove((char *) p + (i+n)*size, (char *) p + i*size, size * (z-i));
   }
   *pp = p;
}